

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O1

void ImageColorContrast(Image *image,float contrast)

{
  int iVar1;
  uint uVar2;
  Image image_00;
  Color *pCVar3;
  uchar *puVar4;
  undefined8 unaff_RBP;
  long lVar5;
  ulong uVar6;
  undefined8 unaff_R14;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined8 unaff_retaddr;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    image_00._8_8_ = unaff_RBP;
    image_00.data = (void *)unaff_R14;
    image_00._16_8_ = unaff_retaddr;
    pCVar3 = LoadImageColors(image_00);
    iVar1 = image->height;
    if (0 < (long)iVar1) {
      fVar8 = -100.0;
      if (-100.0 <= contrast) {
        fVar8 = contrast;
      }
      fVar7 = 100.0;
      if (fVar8 <= 100.0) {
        fVar7 = fVar8;
      }
      fVar8 = (fVar7 + 100.0) / 100.0;
      fVar8 = fVar8 * fVar8;
      uVar2 = image->width;
      puVar4 = &pCVar3->b;
      lVar5 = 0;
      do {
        if (0 < (int)uVar2) {
          uVar6 = 0;
          do {
            fVar9 = (((float)puVar4[uVar6 * 4 + -2] / 255.0 + -0.5) * fVar8 + 0.5) * 255.0;
            fVar7 = 0.0;
            if (0.0 <= fVar9) {
              fVar7 = fVar9;
            }
            fVar9 = 255.0;
            if (fVar7 <= 255.0) {
              fVar9 = fVar7;
            }
            fVar10 = (((float)puVar4[uVar6 * 4 + -1] / 255.0 + -0.5) * fVar8 + 0.5) * 255.0;
            fVar7 = 0.0;
            if (0.0 <= fVar10) {
              fVar7 = fVar10;
            }
            fVar10 = 255.0;
            if (fVar7 <= 255.0) {
              fVar10 = fVar7;
            }
            fVar11 = (((float)puVar4[uVar6 * 4] / 255.0 + -0.5) * fVar8 + 0.5) * 255.0;
            fVar7 = 0.0;
            if (0.0 <= fVar11) {
              fVar7 = fVar11;
            }
            fVar11 = 255.0;
            if (fVar7 <= 255.0) {
              fVar11 = fVar7;
            }
            puVar4[uVar6 * 4 + -2] = (uchar)(int)fVar9;
            puVar4[uVar6 * 4 + -1] = (uchar)(int)fVar10;
            puVar4[uVar6 * 4] = (uchar)(int)fVar11;
            uVar6 = uVar6 + 1;
          } while (uVar2 != uVar6);
        }
        lVar5 = lVar5 + 1;
        puVar4 = puVar4 + (ulong)uVar2 * 4;
      } while (lVar5 != iVar1);
    }
    iVar1 = image->format;
    free(image->data);
    image->data = pCVar3;
    image->format = 7;
    ImageFormat(image,iVar1);
    return;
  }
  return;
}

Assistant:

void ImageColorContrast(Image *image, float contrast)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if (contrast < -100) contrast = -100;
    if (contrast > 100) contrast = 100;

    contrast = (100.0f + contrast)/100.0f;
    contrast *= contrast;

    Color *pixels = LoadImageColors(*image);

    for (int y = 0; y < image->height; y++)
    {
        for (int x = 0; x < image->width; x++)
        {
            float pR = (float)pixels[y*image->width + x].r/255.0f;
            pR -= 0.5;
            pR *= contrast;
            pR += 0.5;
            pR *= 255;
            if (pR < 0) pR = 0;
            if (pR > 255) pR = 255;

            float pG = (float)pixels[y*image->width + x].g/255.0f;
            pG -= 0.5;
            pG *= contrast;
            pG += 0.5;
            pG *= 255;
            if (pG < 0) pG = 0;
            if (pG > 255) pG = 255;

            float pB = (float)pixels[y*image->width + x].b/255.0f;
            pB -= 0.5;
            pB *= contrast;
            pB += 0.5;
            pB *= 255;
            if (pB < 0) pB = 0;
            if (pB > 255) pB = 255;

            pixels[y*image->width + x].r = (unsigned char)pR;
            pixels[y*image->width + x].g = (unsigned char)pG;
            pixels[y*image->width + x].b = (unsigned char)pB;
        }
    }

    int format = image->format;
    RL_FREE(image->data);

    image->data = pixels;
    image->format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;

    ImageFormat(image, format);
}